

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int rtrimCollFunc(void *pUser,int nKey1,void *pKey1,int nKey2,void *pKey2)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  u8 *pK1;
  int iVar4;
  ulong uVar5;
  u8 *pK2;
  
  uVar5 = (ulong)(uint)nKey1;
  uVar3 = (ulong)(uint)nKey2;
  if (nKey1 != 0) {
    uVar5 = (ulong)nKey1;
    do {
      if (*(char *)((long)pKey1 + (uVar5 - 1)) != ' ') goto LAB_001c1149;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
    uVar5 = 0;
  }
LAB_001c1149:
  if (nKey2 != 0) {
    uVar3 = (ulong)nKey2;
    do {
      if (*(char *)((long)pKey2 + (uVar3 - 1)) != ' ') goto LAB_001c115f;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
    uVar3 = 0;
  }
LAB_001c115f:
  iVar4 = (int)uVar5;
  iVar2 = (int)uVar3;
  iVar1 = iVar2;
  if (iVar4 < iVar2) {
    iVar1 = iVar4;
  }
  iVar1 = memcmp(pKey1,pKey2,(long)iVar1);
  if (iVar1 == 0) {
    iVar1 = iVar4 - iVar2;
  }
  return iVar1;
}

Assistant:

static int rtrimCollFunc(
  void *pUser,
  int nKey1, const void *pKey1,
  int nKey2, const void *pKey2
){
  const u8 *pK1 = (const u8*)pKey1;
  const u8 *pK2 = (const u8*)pKey2;
  while( nKey1 && pK1[nKey1-1]==' ' ) nKey1--;
  while( nKey2 && pK2[nKey2-1]==' ' ) nKey2--;
  return binCollFunc(pUser, nKey1, pKey1, nKey2, pKey2);
}